

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_10x26_impl.h
# Opt level: O2

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = flag - 1;
  uVar2 = -flag;
  r->n[0] = a->n[0] & uVar2 | r->n[0] & uVar1;
  r->n[1] = a->n[1] & uVar2 | r->n[1] & uVar1;
  r->n[2] = a->n[2] & uVar2 | r->n[2] & uVar1;
  r->n[3] = a->n[3] & uVar2 | r->n[3] & uVar1;
  r->n[4] = a->n[4] & uVar2 | r->n[4] & uVar1;
  r->n[5] = a->n[5] & uVar2 | r->n[5] & uVar1;
  r->n[6] = a->n[6] & uVar2 | r->n[6] & uVar1;
  r->n[7] = a->n[7] & uVar2 | r->n[7] & uVar1;
  r->n[8] = a->n[8] & uVar2 | r->n[8] & uVar1;
  r->n[9] = uVar2 & a->n[9] | uVar1 & r->n[9];
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    uint32_t mask0, mask1;
    mask0 = flag + ~((uint32_t)0);
    mask1 = ~mask0;
    r->n[0] = (r->n[0] & mask0) | (a->n[0] & mask1);
    r->n[1] = (r->n[1] & mask0) | (a->n[1] & mask1);
    r->n[2] = (r->n[2] & mask0) | (a->n[2] & mask1);
    r->n[3] = (r->n[3] & mask0) | (a->n[3] & mask1);
    r->n[4] = (r->n[4] & mask0) | (a->n[4] & mask1);
    r->n[5] = (r->n[5] & mask0) | (a->n[5] & mask1);
    r->n[6] = (r->n[6] & mask0) | (a->n[6] & mask1);
    r->n[7] = (r->n[7] & mask0) | (a->n[7] & mask1);
    r->n[8] = (r->n[8] & mask0) | (a->n[8] & mask1);
    r->n[9] = (r->n[9] & mask0) | (a->n[9] & mask1);
#ifdef VERIFY
    if (a->magnitude > r->magnitude) {
        r->magnitude = a->magnitude;
    }
    r->normalized &= a->normalized;
#endif
}